

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

char * sysbvm_tuple_bytesToCString(sysbvm_tuple_t tuple)

{
  char *__dest;
  ulong uVar1;
  
  if ((tuple & 0xf) == 0 && tuple != 0) {
    uVar1 = (ulong)*(uint *)(tuple + 0xc);
  }
  else {
    uVar1 = 0;
  }
  __dest = (char *)malloc(uVar1 + 1);
  memcpy(__dest,(void *)(tuple + 0x10),uVar1 + 1);
  __dest[uVar1] = '\0';
  return __dest;
}

Assistant:

SYSBVM_API char *sysbvm_tuple_bytesToCString(sysbvm_tuple_t tuple)
{
    size_t stringSize = sysbvm_tuple_getSizeInBytes(tuple);
    size_t sizeToAllocate = stringSize + 1;
    char *cstring = (char*)malloc(sizeToAllocate);
    memcpy(cstring, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes, sizeToAllocate);
    cstring[stringSize] = 0;
    return cstring;
}